

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O2

void __thiscall
spdlog::logger::log<std::__cxx11::string>
          (logger *this,source_loc source,level_enum lvl,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char *pcVar1;
  size_t sVar2;
  memory_buffer buf;
  char *local_2a8;
  string *local_2a0;
  level_enum local_298;
  undefined8 local_290;
  size_t local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  char *local_268;
  uint32_t local_260;
  size_t local_258;
  char *local_250;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  if ((this->level_).super___atomic_base<int>._M_i <= (int)lvl) {
    local_248.super_basic_buffer<char>.ptr_ = local_248.store_;
    local_248.super_basic_buffer<char>.size_ = 0;
    local_248.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00207e98;
    local_248.super_basic_buffer<char>.capacity_ = 500;
    local_2a8 = fmt;
    ::fmt::v5::format_to<char_const*,std::__cxx11::string,500ul,char>(&local_248,&local_2a8,args);
    sVar2 = local_248.super_basic_buffer<char>.size_;
    pcVar1 = local_248.super_basic_buffer<char>.ptr_;
    local_2a0 = &this->name_;
    local_298 = lvl;
    local_290 = std::chrono::_V2::system_clock::now();
    local_288 = details::os::thread_id();
    local_280 = 0;
    uStack_278 = 0;
    local_270 = 0;
    local_258 = sVar2;
    local_250 = pcVar1;
    local_268 = source.filename;
    local_260 = source.line;
    (*this->_vptr_logger[3])(this,&local_2a0);
    ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              (&local_248);
  }
  return;
}

Assistant:

inline void spdlog::logger::log(source_loc source, level::level_enum lvl, const char *fmt, const Args &... args)
{
    if (!should_log(lvl))
    {
        return;
    }

    try
    {
        using details::fmt_helper::to_string_view;
        fmt::memory_buffer buf;
        fmt::format_to(buf, fmt, args...);
        details::log_msg log_msg(source, &name_, lvl, to_string_view(buf));
        sink_it_(log_msg);
    }
    SPDLOG_CATCH_AND_HANDLE
}